

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<unsigned_int,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,uint *params,char (*params_1) [2])

{
  uint *value;
  char (*value_00) [2];
  ArrayPtr<const_char> local_48;
  CappedArray<char,_14UL> local_38;
  char (*local_20) [2];
  char (*params_local_1) [2];
  uint *params_local;
  
  local_20 = (char (*) [2])params;
  params_local_1 = (char (*) [2])this;
  params_local = (uint *)__return_storage_ptr__;
  value = fwd<unsigned_int>((NoInfer<unsigned_int> *)this);
  toCharSequence<unsigned_int>(&local_38,value);
  value_00 = ::const(local_20);
  local_48 = toCharSequence<char_const(&)[2]>(value_00);
  _::concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,(CappedArray<char,_14UL> *)&local_48,
             (ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}